

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O0

IDenseNetwork * __thiscall IDenseNetwork::Relax(IDenseNetwork *this,Time time)

{
  bool bVar1;
  reference ppIVar2;
  ILayer *layer;
  iterator __end1;
  iterator __begin1;
  vector<ILayer_*,_std::allocator<ILayer_*>_> *__range1;
  Time time_local;
  IDenseNetwork *this_local;
  
  __end1 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::begin(&this->layers);
  layer = (ILayer *)std::vector<ILayer_*,_std::allocator<ILayer_*>_>::end(&this->layers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>
                                *)&layer);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>::
              operator*(&__end1);
    (*(*ppIVar2)->_vptr_ILayer[3])(time);
    __gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>::
    operator++(&__end1);
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::Relax( SPIKING_NN::Time time )
{
    for ( auto layer: layers ) {
        layer->Relax( time );
    }
    return *this;
}